

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int rejected_get_error(REJECTED_HANDLE rejected,ERROR_HANDLE *error_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  REJECTED_INSTANCE *rejected_instance;
  uint32_t item_count;
  int result;
  ERROR_HANDLE *error_value_local;
  REJECTED_HANDLE rejected_local;
  
  if (rejected == (REJECTED_HANDLE)0x0) {
    rejected_instance._4_4_ = 0x45a7;
  }
  else {
    _item_count = error_value;
    error_value_local = (ERROR_HANDLE *)rejected;
    iVar1 = amqpvalue_get_composite_item_count
                      (rejected->composite_value,(uint32_t *)&rejected_instance);
    if (iVar1 == 0) {
      if ((int)rejected_instance == 0) {
        rejected_instance._4_4_ = 0x45b5;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(rejected->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          rejected_instance._4_4_ = 0x45bd;
        }
        else {
          iVar1 = amqpvalue_get_error(value,_item_count);
          if (iVar1 == 0) {
            rejected_instance._4_4_ = 0;
          }
          else {
            rejected_instance._4_4_ = 0x45c4;
          }
        }
      }
    }
    else {
      rejected_instance._4_4_ = 0x45af;
    }
  }
  return rejected_instance._4_4_;
}

Assistant:

int rejected_get_error(REJECTED_HANDLE rejected, ERROR_HANDLE* error_value)
{
    int result;

    if (rejected == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)rejected;
        if (amqpvalue_get_composite_item_count(rejected_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(rejected_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_error(item_value, error_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}